

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

void * mz_zip_extract_archive_file_to_heap_v2
                 (char *pZip_filename,char *pArchive_name,char *pComment,size_t *pSize,mz_uint flags
                 ,mz_zip_error *pErr)

{
  mz_bool mVar1;
  char *local_c0;
  void *p;
  mz_zip_archive zip_archive;
  mz_uint32 file_index;
  mz_zip_error *pErr_local;
  mz_uint flags_local;
  size_t *pSize_local;
  char *pComment_local;
  char *pArchive_name_local;
  char *pZip_filename_local;
  
  local_c0 = (char *)0x0;
  if (pSize != (size_t *)0x0) {
    *pSize = 0;
  }
  if ((pZip_filename == (char *)0x0) || (pArchive_name == (char *)0x0)) {
    if (pErr != (mz_zip_error *)0x0) {
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    }
    pZip_filename_local = (char *)0x0;
  }
  else {
    mz_zip_zero_struct((mz_zip_archive *)&p);
    mVar1 = mz_zip_reader_init_file_v2((mz_zip_archive *)&p,pZip_filename,flags | 0x800,0,0);
    if (mVar1 == 0) {
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = zip_archive.m_zip_mode;
      }
      pZip_filename_local = (char *)0x0;
    }
    else {
      mVar1 = mz_zip_reader_locate_file_v2
                        ((mz_zip_archive *)&p,pArchive_name,pComment,flags,
                         (mz_uint32 *)((long)&zip_archive.m_pState + 4));
      if (mVar1 != 0) {
        local_c0 = (char *)mz_zip_reader_extract_to_heap
                                     ((mz_zip_archive *)&p,zip_archive.m_pState._4_4_,pSize,flags);
      }
      mz_zip_reader_end_internal((mz_zip_archive *)&p,(uint)(local_c0 != (char *)0x0));
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = zip_archive.m_zip_mode;
      }
      pZip_filename_local = local_c0;
    }
  }
  return pZip_filename_local;
}

Assistant:

void *mz_zip_extract_archive_file_to_heap_v2(const char *pZip_filename, const char *pArchive_name, const char *pComment, size_t *pSize, mz_uint flags, mz_zip_error *pErr)
{
    mz_uint32 file_index;
    mz_zip_archive zip_archive;
    void *p = NULL;

    if (pSize)
        *pSize = 0;

    if ((!pZip_filename) || (!pArchive_name))
    {
        if (pErr)
            *pErr = MZ_ZIP_INVALID_PARAMETER;

        return NULL;
    }

    mz_zip_zero_struct(&zip_archive);
    if (!mz_zip_reader_init_file_v2(&zip_archive, pZip_filename, flags | MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY, 0, 0))
    {
        if (pErr)
            *pErr = zip_archive.m_last_error;

        return NULL;
    }

    if (mz_zip_reader_locate_file_v2(&zip_archive, pArchive_name, pComment, flags, &file_index))
    {
        p = mz_zip_reader_extract_to_heap(&zip_archive, file_index, pSize, flags);
    }

    mz_zip_reader_end_internal(&zip_archive, p != NULL);

    if (pErr)
        *pErr = zip_archive.m_last_error;

    return p;
}